

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O2

void Gia_ManUnrollDup_rec(Gia_Man_t *pNew,Gia_Obj_t *pObj,int Id)

{
  uint uVar1;
  int iLit1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  
  if (pObj->Value == 0xffffffff) {
    uVar1 = (uint)*(ulong *)pObj;
    if ((~uVar1 & 0x9fffffff) == 0) {
      uVar1 = Gia_ManAppendCi(pNew);
    }
    else {
      uVar4 = *(ulong *)pObj & 0x1fffffff;
      if (uVar4 == 0x1fffffff || -1 < (int)uVar1) {
        if (((int)uVar1 < 0) || ((int)uVar4 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaFrames.c"
                        ,0x5c,"void Gia_ManUnrollDup_rec(Gia_Man_t *, Gia_Obj_t *, int)");
        }
        Gia_ManUnrollDup_rec(pNew,pObj + -uVar4,Id - (uVar1 & 0x1fffffff));
        uVar1 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
        Gia_ManUnrollDup_rec(pNew,pObj + -(ulong)(uVar1 & 0x1fffffff),Id - (uVar1 & 0x1fffffff));
        iVar2 = Gia_ObjFanin0Copy(pObj);
        iLit1 = Gia_ObjFanin1Copy(pObj);
        uVar1 = Gia_ManAppendAnd(pNew,iVar2,iLit1);
      }
      else {
        Gia_ManUnrollDup_rec(pNew,pObj + -uVar4,Id - (uVar1 & 0x1fffffff));
        iVar2 = Gia_ObjFanin0Copy(pObj);
        uVar1 = Gia_ManAppendCo(pNew,iVar2);
      }
    }
    pObj->Value = uVar1;
    iVar2 = Abc_Lit2Var(uVar1);
    pGVar3 = Gia_ManObj(pNew,iVar2);
    pGVar3->Value = Id;
  }
  return;
}

Assistant:

void Gia_ManUnrollDup_rec( Gia_Man_t * pNew, Gia_Obj_t * pObj, int Id ) 
{
    if ( ~pObj->Value )
        return;
    if ( Gia_ObjIsCi(pObj) )
        pObj->Value = Gia_ManAppendCi(pNew);
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin0(pObj), Gia_ObjFaninId0(pObj, Id) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin0(pObj), Gia_ObjFaninId0(pObj, Id) );
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin1(pObj), Gia_ObjFaninId1(pObj, Id) );
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    else assert( 0 );
    Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Id;
}